

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O3

void pnga_set_tiled_irreg_proc_grid(Integer g_a,Integer *mapc,Integer *nblocks,Integer *proc_grid)

{
  C_Integer *pCVar1;
  long lVar2;
  long icode;
  global_array_t *pgVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  lVar6 = g_a + 1000;
  if (GA[g_a + 1000].actv == 1) {
    pnga_error("Cannot set irregular tiled data distribution on array that has been allocated",0);
  }
  if (((0 < GA[lVar6].ndim) ||
      (pnga_error("Cannot set irregular tiled data distribution if array size not set",0),
      0 < GA[lVar6].ndim)) ||
     (pnga_error("Dimensions must be set before irregular distribution is specified",0), pgVar3 = GA
     , 0 < GA[lVar6].ndim)) {
    lVar4 = 0;
    pgVar3 = GA;
    do {
      if (pgVar3[g_a + 1000].dims[lVar4] < nblocks[lVar4]) {
        pnga_error("number of blocks must be <= corresponding dimension",lVar4);
        pgVar3 = GA;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < pgVar3[lVar6].ndim);
  }
  if (pgVar3[lVar6].distr_type != 0) {
    pnga_error("Cannot reset irregular tiled data distribution on array that has been set",0);
    pgVar3 = GA;
  }
  pgVar3[lVar6].distr_type = 4;
  if (0 < pgVar3[lVar6].ndim) {
    lVar5 = 0;
    lVar4 = 0;
    do {
      lVar7 = mapc[lVar4];
      if ((lVar7 < 1) || (pgVar3[lVar6].dims[lVar5] + 1 < lVar7)) {
        pnga_error("Mapc entry outside array dimension limits",lVar7);
      }
      if (nblocks[lVar5] < 2) {
        lVar4 = lVar4 + 1;
      }
      else {
        lVar2 = 1;
        do {
          icode = mapc[lVar4 + lVar2];
          if (icode < lVar7) {
            pnga_error("Mapc entries are not properly monotonic",lVar7);
            icode = mapc[lVar4 + lVar2];
          }
          if ((icode < 1) || (GA[lVar6].dims[lVar5] + 1 < icode)) {
            pnga_error("Mapc entry outside array dimension limits",icode);
          }
          lVar2 = lVar2 + 1;
          lVar7 = icode;
        } while (lVar2 < nblocks[lVar5]);
        lVar4 = lVar4 + lVar2;
      }
      lVar5 = lVar5 + 1;
      pgVar3 = GA;
    } while (lVar5 < GA[lVar6].ndim);
    if (0 < GA[lVar6].ndim) {
      lVar4 = 0;
      lVar5 = 0;
      do {
        lVar7 = nblocks[lVar4];
        pgVar3[g_a + 1000].num_blocks[lVar4] = lVar7;
        lVar2 = proc_grid[lVar4];
        if (lVar2 < 1) {
          pnga_error("Processor grid dimensions must all be greater than zero",0);
          lVar2 = proc_grid[lVar4];
          pgVar3 = GA;
        }
        lVar5 = lVar5 + lVar7;
        pgVar3[g_a + 1000].nblock[lVar4] = (int)lVar2;
        lVar4 = lVar4 + 1;
      } while (lVar4 < pgVar3[lVar6].ndim);
      goto LAB_001700ba;
    }
  }
  lVar5 = 0;
LAB_001700ba:
  pCVar1 = (C_Integer *)malloc(lVar5 * 8 + 8);
  pgVar3[lVar6].mapc = pCVar1;
  pgVar3 = GA;
  pCVar1 = GA[lVar6].mapc;
  if (0 < lVar5) {
    lVar4 = 0;
    do {
      pCVar1[lVar4] = mapc[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar5 != lVar4);
  }
  pCVar1[lVar5] = -1;
  pgVar3[lVar6].irreg = 1;
  lVar4 = 1;
  if (0 < (long)pgVar3[lVar6].ndim) {
    lVar5 = 0;
    do {
      lVar4 = lVar4 * pgVar3[lVar6].num_blocks[lVar5];
      lVar5 = lVar5 + 1;
    } while (pgVar3[lVar6].ndim != lVar5);
  }
  pgVar3[lVar6].block_total = lVar4;
  return;
}

Assistant:

void pnga_set_tiled_irreg_proc_grid(Integer g_a, Integer *mapc, Integer *nblocks,
    Integer *proc_grid)
{
  Integer i, j, ichk, maplen, jsize;
  Integer ga_handle = g_a + GA_OFFSET;
  if (GA[ga_handle].actv == 1)
    pnga_error("Cannot set irregular tiled data distribution on array"
        " that has been allocated",0);
  if (!(GA[ga_handle].ndim > 0))
    pnga_error("Cannot set irregular tiled data distribution if array size not set",0);
  if (GA[ga_handle].ndim < 1)
    pnga_error("Dimensions must be set before irregular distribution is specified",0);
  for (i=0; i<GA[ga_handle].ndim; i++)
    if ((C_Integer)nblocks[i] > GA[ga_handle].dims[i])
      pnga_error("number of blocks must be <= corresponding dimension",i);
  if (GA[ga_handle].distr_type != REGULAR)
    pnga_error("Cannot reset irregular tiled data distribution on array that has been set",0);
  GA[ga_handle].distr_type = TILED_IRREG;
  /* Check to see that mapc array is sensible */
  maplen = 0;
  for (i=0; i<GA[ga_handle].ndim; i++) {
    ichk = mapc[maplen];
    if (ichk < 1 || ichk > GA[ga_handle].dims[i]+1)
      pnga_error("Mapc entry outside array dimension limits",ichk);
    maplen++;
    for (j=1; j<nblocks[i]; j++) {
      if (mapc[maplen] < ichk) {
        pnga_error("Mapc entries are not properly monotonic",ichk);
      }
      ichk = mapc[maplen];
      if (ichk < 1 || ichk > GA[ga_handle].dims[i]+1)
        pnga_error("Mapc entry outside array dimension limits",ichk);
      maplen++;
    }
  }

  maplen = 0;
  for (i=0; i<GA[ga_handle].ndim; i++) {
    maplen += nblocks[i];
    GA[ga_handle].num_blocks[i] = (C_Integer)nblocks[i];
    if (proc_grid[i] < 1)
      pnga_error("Processor grid dimensions must all be greater than zero",0);
    GA[ga_handle].nblock[i] = proc_grid[i];
  }
  GA[ga_handle].mapc = (C_Integer*)malloc((maplen+1)*sizeof(C_Integer*));
  for (i=0; i<maplen; i++) {
    GA[ga_handle].mapc[i] = (C_Integer)mapc[i];
  }
  GA[ga_handle].mapc[maplen] = -1;
  GA[ga_handle].irreg = 1;

  /* Find total number of blocks */
  jsize = 1;
  for (i=0; i<GA[ga_handle].ndim; i++) {
    jsize *= GA[ga_handle].num_blocks[i];
  }
  GA[ga_handle].block_total = jsize;
}